

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nicdrv.c
# Opt level: O3

int ecx_srconfirm(ecx_portt *port,int idx,int timeout)

{
  boolean bVar1;
  int iVar2;
  uint32 timeout_usec;
  osal_timert timer2;
  osal_timert timer1;
  osal_timert local_40;
  osal_timert local_38;
  
  osal_timer_start(&local_38,timeout);
  timeout_usec = 2000;
  if (timeout < 2000) {
    timeout_usec = timeout;
  }
  do {
    ecx_outframe_red(port,idx);
    osal_timer_start(&local_40,timeout_usec);
    iVar2 = ecx_waitinframe_red(port,idx,&local_40);
    if (-1 < iVar2) {
      return iVar2;
    }
    bVar1 = osal_timer_is_expired(&local_38);
  } while (bVar1 == '\0');
  port->rxbufstat[idx] = 0;
  if (port->redstate != 0) {
    port->redport->rxbufstat[idx] = 0;
  }
  return iVar2;
}

Assistant:

int ecx_srconfirm(ecx_portt *port, int idx, int timeout)
{
   int wkc = EC_NOFRAME;
   osal_timert timer1, timer2;

   osal_timer_start (&timer1, timeout);
   do 
   {
      /* tx frame on primary and if in redundant mode a dummy on secondary */
      ecx_outframe_red(port, idx);
      if (timeout < EC_TIMEOUTRET) 
      {
         osal_timer_start (&timer2, timeout); 
      }
      else 
      {
         /* normally use partial timout for rx */
         osal_timer_start (&timer2, EC_TIMEOUTRET); 
      }
      /* get frame from primary or if in redundant mode possibly from secondary */
      wkc = ecx_waitinframe_red(port, idx, &timer2);
   /* wait for answer with WKC>=0 or otherwise retry until timeout */   
   } while ((wkc <= EC_NOFRAME) && !osal_timer_is_expired (&timer1));
   /* if nothing received, clear buffer index status so it can be used again */
   if (wkc <= EC_NOFRAME) 
   {
      ecx_setbufstat(port, idx, EC_BUF_EMPTY);
   }
   
   return wkc;
}